

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

vw * parse_args(options_i *options,trace_message_t trace_listener,void *trace_context)

{
  _func_int **pp_Var1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  vw *pvVar5;
  typed_option<unsigned_long> *ptVar6;
  parser *this;
  option_group_definition *poVar7;
  typed_option<int> *op;
  AllReduceSockets *this_00;
  vw_exception *this_01;
  byte bVar8;
  byte bVar9;
  int span_server_port_arg;
  option_group_definition weight_args;
  size_t unique_id_arg;
  size_t ring_size;
  size_t node_arg;
  size_t total_arg;
  option_group_definition update_args;
  option_group_definition vw_args;
  string span_server_arg;
  option_group_definition parallelization_args;
  stringstream __msg;
  undefined1 *local_a38 [2];
  undefined1 local_a28 [16];
  undefined1 *local_a18 [2];
  undefined1 local_a08 [16];
  undefined1 *local_9f8 [2];
  undefined1 local_9e8 [20];
  int local_9d4;
  undefined1 *local_9d0 [2];
  undefined1 local_9c0 [16];
  undefined1 *local_9b0 [2];
  undefined1 local_9a0 [16];
  vw *local_990;
  option_group_definition local_988;
  undefined1 *local_950 [2];
  undefined1 local_940 [16];
  size_t local_930;
  undefined1 local_928 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_890;
  string local_888;
  string local_868;
  undefined1 *local_848 [2];
  undefined1 local_838 [16];
  undefined1 *local_828 [2];
  undefined1 local_818 [16];
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  undefined1 *local_728;
  long local_720;
  undefined1 local_718 [16];
  undefined1 *local_708;
  long local_700;
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_660;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_650;
  undefined1 *local_648;
  long local_640;
  undefined1 local_638 [16];
  undefined1 *local_628;
  long local_620;
  undefined1 local_618 [16];
  undefined1 local_608 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_580;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_570;
  option_group_definition local_568;
  option_group_definition local_530;
  undefined1 local_4f8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_460;
  undefined1 local_458 [48];
  string local_428 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c0;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [40];
  pointer psStack_250;
  _Alloc_hider local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  undefined1 local_1d8 [48];
  string local_1a8 [32];
  string local_188 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  string local_50;
  
  pvVar5 = (vw *)operator_new(0x3658);
  vw::vw(pvVar5);
  pvVar5->options = options;
  if (trace_listener != (trace_message_t)0x0) {
    *(trace_message_t *)&(pvVar5->trace_message).super_ostream.field_0x80 = trace_listener;
    *(void **)&(pvVar5->trace_message).super_ostream.field_0x78 = trace_context;
  }
  time(&pvVar5->init_time);
  local_990 = pvVar5;
  local_628 = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"VW options","");
  local_530.m_name._M_dataplus._M_p = (pointer)&local_530.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_530,local_628,local_628 + local_620);
  local_530.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_530.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_530.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_628 != local_618) {
    operator_delete(local_628);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"ring_size","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_1d8,&local_298,&local_930);
  ptVar6 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_1d8,0x100);
  local_928._0_8_ = local_928 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"size of example ring","");
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_530,ptVar6);
  if ((undefined1 *)local_928._0_8_ != local_928 + 0x10) {
    operator_delete((void *)local_928._0_8_);
  }
  local_1d8._0_8_ = &PTR__typed_option_0030afc8;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_530);
  this = (parser *)operator_new(0x398);
  parser::parser(this,local_930);
  pvVar5->p = this;
  local_648 = local_638;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_648,"Update options","");
  local_568.m_name._M_dataplus._M_p = (pointer)&local_568.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_568,local_648,local_648 + local_640);
  local_568.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_568.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_648 != local_638) {
    operator_delete(local_648);
  }
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"learning_rate","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_1d8,&local_748,&pvVar5->eta);
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"Set learning rate","");
  std::__cxx11::string::_M_assign(local_1a8);
  local_458._0_8_ = local_458 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_458,"l","");
  std::__cxx11::string::_M_assign(local_188);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (&local_568,(typed_option<float> *)local_1d8);
  local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"power_t","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_928,&local_768,&pvVar5->power_t);
  local_988.m_name._M_dataplus._M_p = (pointer)&local_988.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_988,"t power value","");
  std::__cxx11::string::_M_assign((string *)(local_928 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar7,(typed_option<float> *)local_928);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"decay_learning_rate","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_608,&local_2b8,&pvVar5->eta_decay_rate);
  local_a38[0] = local_a28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a38,"Set Decay factor for learning_rate between passes","");
  std::__cxx11::string::_M_assign((string *)(local_608 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar7,(typed_option<float> *)local_608);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"initial_t","");
  VW::config::typed_option<double>::typed_option
            ((typed_option<double> *)local_4f8,&local_2d8,&pvVar5->sd->t);
  local_9f8[0] = local_9e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"initial t value","");
  std::__cxx11::string::_M_assign((string *)(local_4f8 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<double>&>
                     (poVar7,(typed_option<double> *)local_4f8);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"feature_mask","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_6e8,&local_2f8,&pvVar5->feature_mask);
  local_a18[0] = local_a08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a18,
             "Use existing regressor to determine which parameters may be updated.  If no initial_regressor given, also used for initial weights."
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_6e8 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar7,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_6e8);
  if (local_a18[0] != local_a08) {
    operator_delete(local_a18[0]);
  }
  local_6e8._0_8_ = &PTR__typed_option_00308c40;
  if (local_650._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_650._M_pi);
  }
  if (local_660._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_660._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if (local_9f8[0] != local_9e8) {
    operator_delete(local_9f8[0]);
  }
  local_4f8._0_8_ = &PTR__typed_option_0030afe8;
  if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
  }
  if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if (local_a38[0] != local_a28) {
    operator_delete(local_a38[0]);
  }
  local_608._0_8_ = &PTR__typed_option_003086f0;
  if (local_570._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_570._M_pi);
  }
  if (local_580._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_580._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_608);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_name._M_dataplus._M_p != &local_988.m_name.field_2) {
    operator_delete(local_988.m_name._M_dataplus._M_p);
  }
  local_928._0_8_ = &PTR__typed_option_003086f0;
  if (local_890._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_890._M_pi);
  }
  if (local_8a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_928);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_768._M_dataplus._M_p != &local_768.field_2) {
    operator_delete(local_768._M_dataplus._M_p);
  }
  if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_);
  }
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_);
  }
  local_1d8._0_8_ = &PTR__typed_option_003086f0;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_568);
  local_708 = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"Weight options","");
  local_988.m_name._M_dataplus._M_p = (pointer)&local_988.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_988,local_708,local_708 + local_700);
  local_988.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_988.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_988.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_708 != local_6f8) {
    operator_delete(local_708);
  }
  local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"initial_regressor","");
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_1d8,&local_788,&pvVar5->initial_regressors);
  local_a38[0] = local_a28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"Initial regressor(s)","");
  std::__cxx11::string::_M_assign(local_1a8);
  local_9f8[0] = local_9e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"i","");
  std::__cxx11::string::_M_assign(local_188);
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (&local_988,
                      (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_1d8);
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"initial_weight","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_928,&local_7a8,&pvVar5->initial_weight);
  local_a18[0] = local_a08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a18,"Set all weights to an initial value of arg.","");
  std::__cxx11::string::_M_assign((string *)(local_928 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar7,(typed_option<float> *)local_928);
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"random_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_608,&local_7c8,&pvVar5->random_weights);
  local_9b0[0] = local_9a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9b0,"make initial weights random","");
  std::__cxx11::string::_M_assign((string *)(local_608 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_608);
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e8,"normal_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_4f8,&local_7e8,&pvVar5->normal_weights);
  local_9d0[0] = local_9c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9d0,"make initial weights normal","");
  std::__cxx11::string::_M_assign((string *)(local_4f8 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_4f8);
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_808,"truncated_normal_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_6e8,&local_808,&pvVar5->tnormal_weights);
  local_950[0] = local_940;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_950,"make initial weights truncated normal","");
  std::__cxx11::string::_M_assign((string *)(local_6e8 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_6e8);
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"sparse_weights","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_278,&local_318,&(pvVar5->weights).sparse);
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_828,"Use a sparse datastructure for weights","");
  std::__cxx11::string::_M_assign((string *)&local_248);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_278);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,"input_feature_regularizer","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_458,&local_338,&pvVar5->per_feature_regularizer_input);
  local_848[0] = local_838;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_848,"Per feature regularization input file","");
  std::__cxx11::string::_M_assign(local_428);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar7,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_458);
  if (local_848[0] != local_838) {
    operator_delete(local_848[0]);
  }
  local_458._0_8_ = &PTR__typed_option_00308c40;
  if (local_3c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0._M_pi);
  }
  if (local_3d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  if (local_828[0] != local_818) {
    operator_delete(local_828[0]);
  }
  local_278._0_8_ = &PTR__typed_option_00308c78;
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if (local_950[0] != local_940) {
    operator_delete(local_950[0]);
  }
  local_6e8._0_8_ = &PTR__typed_option_00308c78;
  if (local_650._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_650._M_pi);
  }
  if (local_660._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_660._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p);
  }
  if (local_9d0[0] != local_9c0) {
    operator_delete(local_9d0[0]);
  }
  local_4f8._0_8_ = &PTR__typed_option_00308c78;
  if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
  }
  if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
    operator_delete(local_7e8._M_dataplus._M_p);
  }
  if (local_9b0[0] != local_9a0) {
    operator_delete(local_9b0[0]);
  }
  local_608._0_8_ = &PTR__typed_option_00308c78;
  if (local_570._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_570._M_pi);
  }
  if (local_580._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_580._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_608);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p);
  }
  if (local_a18[0] != local_a08) {
    operator_delete(local_a18[0]);
  }
  local_928._0_8_ = &PTR__typed_option_003086f0;
  if (local_890._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_890._M_pi);
  }
  if (local_8a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_928);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p);
  }
  if (local_9f8[0] != local_9e8) {
    operator_delete(local_9f8[0]);
  }
  if (local_a38[0] != local_a28) {
    operator_delete(local_a38[0]);
  }
  local_1d8._0_8_ = &PTR__typed_option_00308760;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != &local_788.field_2) {
    operator_delete(local_788._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_988);
  local_458._0_8_ = local_458 + 0x10;
  local_458._8_8_ = (pointer)0x0;
  local_458[0x10] = '\0';
  local_728 = local_718;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_728,"Parallelization options","")
  ;
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char*>((string *)local_278,local_728,local_728 + local_720);
  local_278._32_8_ = 0;
  psStack_250 = (pointer)0x0;
  local_248._M_p = (pointer)0x0;
  if (local_728 != local_718) {
    operator_delete(local_728);
  }
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_868,"span_server","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1d8,&local_868,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458);
  local_a38[0] = local_a28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a38,"Location of server for setting up spanning tree","");
  std::__cxx11::string::_M_assign(local_1a8);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     ((option_group_definition *)local_278,
                      (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1d8);
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"unique_id","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_928,&local_888,(unsigned_long *)local_950);
  ptVar6 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_928,0);
  local_9f8[0] = local_9e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9f8,"unique id used for cluster parallel jobs","");
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar7,ptVar6);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"total","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_608,&local_358,(unsigned_long *)local_828);
  ptVar6 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_608,1);
  local_a18[0] = local_a08;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a18,"total number of nodes used in cluster parallel job","");
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar7,ptVar6);
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"node","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_4f8,&local_378,(unsigned_long *)local_848);
  ptVar6 = VW::config::typed_option<unsigned_long>::default_value
                     ((typed_option<unsigned_long> *)local_4f8,0);
  local_9b0[0] = local_9a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9b0,"node number in cluster parallel job","");
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar7,ptVar6);
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"span_server_port","");
  VW::config::typed_option<int>::typed_option((typed_option<int> *)local_6e8,&local_398,&local_9d4);
  op = VW::config::typed_option<int>::default_value((typed_option<int> *)local_6e8,0x67af);
  local_9d0[0] = local_9c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9d0,"Port of the server for setting up spanning tree","");
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar7,op);
  if (local_9d0[0] != local_9c0) {
    operator_delete(local_9d0[0]);
  }
  local_6e8._0_8_ = &PTR__typed_option_00308688;
  if (local_650._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_650._M_pi);
  }
  if (local_660._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_660._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_6e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p);
  }
  if (local_9b0[0] != local_9a0) {
    operator_delete(local_9b0[0]);
  }
  local_4f8._0_8_ = &PTR__typed_option_0030afc8;
  if (local_460._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_460._M_pi);
  }
  if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_4f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p);
  }
  if (local_a18[0] != local_a08) {
    operator_delete(local_a18[0]);
  }
  local_608._0_8_ = &PTR__typed_option_0030afc8;
  if (local_570._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_570._M_pi);
  }
  if (local_580._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_580._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_608);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p);
  }
  if (local_9f8[0] != local_9e8) {
    operator_delete(local_9f8[0]);
  }
  local_928._0_8_ = &PTR__typed_option_0030afc8;
  if (local_890._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_890._M_pi);
  }
  if (local_8a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8a0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_928);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p);
  }
  if (local_a38[0] != local_a28) {
    operator_delete(local_a38[0]);
  }
  local_1d8._0_8_ = &PTR__typed_option_00308c40;
  if (local_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140._M_pi);
  }
  if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,local_278);
  pp_Var1 = (_func_int **)(local_1d8 + 0x10);
  local_1d8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"total","");
  iVar4 = (*options->_vptr_options_i[1])(options,local_1d8);
  bVar3 = (byte)iVar4;
  if (bVar3 == 0) {
    local_928._0_8_ = local_928 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"node","");
    iVar4 = (*options->_vptr_options_i[1])(options,local_928);
    if ((char)iVar4 != '\0') goto LAB_00170fa4;
    local_608._0_8_ = local_608 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"unique_id","");
    iVar4 = (*options->_vptr_options_i[1])(options,local_608);
    bVar2 = true;
    bVar8 = 1;
    if ((char)iVar4 != '\0') goto LAB_00170fa7;
    bVar9 = 0;
LAB_00171102:
    if ((undefined1 *)local_608._0_8_ != local_608 + 0x10) {
      operator_delete((void *)local_608._0_8_);
    }
    if (bVar8 == 0) goto LAB_00171137;
  }
  else {
LAB_00170fa4:
    bVar2 = false;
LAB_00170fa7:
    local_4f8._0_8_ = local_4f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"total","");
    iVar4 = (*options->_vptr_options_i[1])(options,local_4f8);
    bVar9 = 1;
    if ((char)iVar4 != '\0') {
      local_6e8._0_8_ = local_6e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"node","");
      iVar4 = (*options->_vptr_options_i[1])(options,local_6e8);
      bVar9 = 1;
      if ((char)iVar4 != '\0') {
        local_a38[0] = local_a28;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"unique_id","");
        iVar4 = (*options->_vptr_options_i[1])(options,local_a38);
        if (local_a38[0] != local_a28) {
          operator_delete(local_a38[0]);
        }
        bVar9 = (byte)iVar4 ^ 1;
      }
      if ((undefined1 *)local_6e8._0_8_ != local_6e8 + 0x10) {
        operator_delete((void *)local_6e8._0_8_);
      }
    }
    if ((undefined1 *)local_4f8._0_8_ != local_4f8 + 0x10) {
      operator_delete((void *)local_4f8._0_8_);
    }
    if (bVar2) {
      bVar8 = bVar3 ^ 1;
      goto LAB_00171102;
    }
    if (bVar3 != 0) goto LAB_00171137;
  }
  if ((undefined1 *)local_928._0_8_ != local_928 + 0x10) {
    operator_delete((void *)local_928._0_8_);
  }
LAB_00171137:
  if ((_func_int **)local_1d8._0_8_ != pp_Var1) {
    operator_delete((void *)local_1d8._0_8_);
  }
  if (bVar9 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1d8 + 0x10),
               "you must specificy unique_id, total, and node if you specify any",0x40);
    this_01 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this_01,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
               ,0x54e,&local_50);
    __cxa_throw(this_01,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_1d8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"span_server","");
  iVar4 = (*options->_vptr_options_i[1])(options,local_1d8);
  if ((_func_int **)local_1d8._0_8_ != pp_Var1) {
    operator_delete((void *)local_1d8._0_8_);
  }
  pvVar5 = local_990;
  if ((char)iVar4 != '\0') {
    local_990->all_reduce_type = Socket;
    this_00 = (AllReduceSockets *)operator_new(0x78);
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3b8,local_458._0_8_,(pointer)(local_458._8_8_ + local_458._0_8_));
    AllReduceSockets::AllReduceSockets
              (this_00,&local_3b8,local_9d4,(size_t)local_950[0],(size_t)local_828[0],
               (size_t)local_848[0]);
    pvVar5->all_reduce = (AllReduce *)this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p);
    }
  }
  parse_diagnostics(options,pvVar5);
  pvVar5->initial_t = (float)pvVar5->sd->t;
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
             *)(local_278 + 0x20));
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_);
  }
  if ((undefined1 *)local_458._0_8_ != local_458 + 0x10) {
    operator_delete((void *)local_458._0_8_);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_988.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_988.m_name._M_dataplus._M_p != &local_988.m_name.field_2) {
    operator_delete(local_988.m_name._M_dataplus._M_p);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_568.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568.m_name._M_dataplus._M_p != &local_568.m_name.field_2) {
    operator_delete(local_568.m_name._M_dataplus._M_p);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_530.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.m_name._M_dataplus._M_p != &local_530.m_name.field_2) {
    operator_delete(local_530.m_name._M_dataplus._M_p);
  }
  return pvVar5;
}

Assistant:

vw& parse_args(options_i& options, trace_message_t trace_listener, void* trace_context)
{
  vw& all = *(new vw());
  all.options = &options;

  if (trace_listener)
  {
    all.trace_message.trace_listener = trace_listener;
    all.trace_message.trace_context = trace_context;
  }

  try
  {
    time(&all.init_time);

    size_t ring_size;
    option_group_definition vw_args("VW options");
    vw_args.add(make_option("ring_size", ring_size).default_value(256).help("size of example ring"));
    options.add_and_parse(vw_args);

    all.p = new parser{ring_size};

    option_group_definition update_args("Update options");
    update_args.add(make_option("learning_rate", all.eta).help("Set learning rate").short_name("l"))
        .add(make_option("power_t", all.power_t).help("t power value"))
        .add(make_option("decay_learning_rate", all.eta_decay_rate)
                 .help("Set Decay factor for learning_rate between passes"))
        .add(make_option("initial_t", all.sd->t).help("initial t value"))
        .add(make_option("feature_mask", all.feature_mask)
                 .help("Use existing regressor to determine which parameters may be updated.  If no initial_regressor "
                       "given, also used for initial weights."));
    options.add_and_parse(update_args);

    option_group_definition weight_args("Weight options");
    weight_args
        .add(make_option("initial_regressor", all.initial_regressors).help("Initial regressor(s)").short_name("i"))
        .add(make_option("initial_weight", all.initial_weight).help("Set all weights to an initial value of arg."))
        .add(make_option("random_weights", all.random_weights).help("make initial weights random"))
        .add(make_option("normal_weights", all.normal_weights).help("make initial weights normal"))
        .add(make_option("truncated_normal_weights", all.tnormal_weights).help("make initial weights truncated normal"))
        .add(make_option("sparse_weights", all.weights.sparse).help("Use a sparse datastructure for weights"))
        .add(make_option("input_feature_regularizer", all.per_feature_regularizer_input)
                 .help("Per feature regularization input file"));
    options.add_and_parse(weight_args);

    std::string span_server_arg;
    int span_server_port_arg;
    // bool threads_arg;
    size_t unique_id_arg;
    size_t total_arg;
    size_t node_arg;
    option_group_definition parallelization_args("Parallelization options");
    parallelization_args
        .add(make_option("span_server", span_server_arg).help("Location of server for setting up spanning tree"))
        //(make_option("threads", threads_arg).help("Enable multi-threading")) Unused option?
        .add(make_option("unique_id", unique_id_arg).default_value(0).help("unique id used for cluster parallel jobs"))
        .add(
            make_option("total", total_arg).default_value(1).help("total number of nodes used in cluster parallel job"))
        .add(make_option("node", node_arg).default_value(0).help("node number in cluster parallel job"))
        .add(make_option("span_server_port", span_server_port_arg).default_value(26543)
          .help("Port of the server for setting up spanning tree"));
    options.add_and_parse(parallelization_args);

    // total, unique_id and node must be specified together.
    if ((options.was_supplied("total") || options.was_supplied("node") || options.was_supplied("unique_id")) &&
        !(options.was_supplied("total") && options.was_supplied("node") && options.was_supplied("unique_id")))
    {
      THROW("you must specificy unique_id, total, and node if you specify any");
    }

    if (options.was_supplied("span_server"))
    {
      all.all_reduce_type = AllReduceType::Socket;
      all.all_reduce = new AllReduceSockets(span_server_arg, span_server_port_arg, unique_id_arg, total_arg, node_arg);
    }

    parse_diagnostics(options, all);

    all.initial_t = (float)all.sd->t;
    return all;
  }
  catch (...)
  {
    VW::finish(all);
    throw;
  }
}